

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O1

_Bool smtp_endofresp(Curl_easy *data,connectdata *conn,char *line,size_t len,int *resp)

{
  smtpstate sVar1;
  _Bool _Var2;
  int iVar3;
  long slnum;
  ulong uVar4;
  char local_2e [3];
  undefined1 auStack_2b [3];
  
  if (len < 4) {
    return false;
  }
  if ((((byte)(*line - 0x30U) < 10) && ((byte)(line[1] - 0x30U) < 10)) &&
     ((byte)(line[2] - 0x30U) < 10)) {
    if (len == 5 || line[3] == ' ') {
      uVar4 = (ulong)((uint)(len == 5) * 2);
      memset(auStack_2b + uVar4,0,uVar4 ^ 3);
      memcpy(local_2e,line,uVar4 + 3);
      slnum = strtol(local_2e,(char **)0x0,10);
      iVar3 = curlx_sltosi(slnum);
      if (iVar3 == 1) {
        iVar3 = 0;
      }
      *resp = iVar3;
    }
    else {
      if ((line[3] != '-') ||
         ((sVar1 = (conn->proto).smtpc.state, sVar1 != SMTP_COMMAND && (sVar1 != SMTP_EHLO))))
      goto LAB_00158654;
      *resp = 1;
    }
    _Var2 = true;
  }
  else {
LAB_00158654:
    _Var2 = false;
  }
  return _Var2;
}

Assistant:

static bool smtp_endofresp(struct Curl_easy *data, struct connectdata *conn,
                           char *line, size_t len, int *resp)
{
  struct smtp_conn *smtpc = &conn->proto.smtpc;
  bool result = FALSE;
  (void)data;

  /* Nothing for us */
  if(len < 4 || !ISDIGIT(line[0]) || !ISDIGIT(line[1]) || !ISDIGIT(line[2]))
    return FALSE;

  /* Do we have a command response? This should be the response code followed
     by a space and optionally some text as per RFC-5321 and as outlined in
     Section 4. Examples of RFC-4954 but some email servers ignore this and
     only send the response code instead as per Section 4.2. */
  if(line[3] == ' ' || len == 5) {
    char tmpline[6];

    result = TRUE;
    memset(tmpline, '\0', sizeof(tmpline));
    memcpy(tmpline, line, (len == 5 ? 5 : 3));
    *resp = curlx_sltosi(strtol(tmpline, NULL, 10));

    /* Make sure real server never sends internal value */
    if(*resp == 1)
      *resp = 0;
  }
  /* Do we have a multiline (continuation) response? */
  else if(line[3] == '-' &&
          (smtpc->state == SMTP_EHLO || smtpc->state == SMTP_COMMAND)) {
    result = TRUE;
    *resp = 1;  /* Internal response code */
  }

  return result;
}